

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall anon_unknown.dwarf_1d4eae8::InfoWriter::Save(InfoWriter *this,string *filename)

{
  undefined1 extraout_AL;
  size_t __n;
  StyledStreamWriter jsonWriter;
  cmGeneratedFileStream fileStream;
  String local_310;
  StyledStreamWriter local_2f0;
  undefined1 local_280 [616];
  
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_280,true);
  __n = 1;
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_280,filename,false,true);
  if (((byte)(*(_func_int **)(local_280._0_8_ + -0x18))[(long)(local_280 + 0x20)] & 5) == 0) {
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"\t","");
    Json::StyledStreamWriter::StyledStreamWriter(&local_2f0,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    Json::StyledStreamWriter::write(&local_2f0,(int)local_280,this,__n);
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_280);
    Json::StyledStreamWriter::~StyledStreamWriter(&local_2f0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  return (bool)extraout_AL;
}

Assistant:

bool InfoWriter::Save(std::string const& filename)
{
  cmGeneratedFileStream fileStream;
  fileStream.SetCopyIfDifferent(true);
  fileStream.Open(filename, false, true);
  if (!fileStream) {
    return false;
  }

  Json::StyledStreamWriter jsonWriter;
  try {
    jsonWriter.write(fileStream, this->Value_);
  } catch (...) {
    return false;
  }

  return fileStream.Close();
}